

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

void __thiscall ON_SubDHeap::ReturnVertex(ON_SubDHeap *this,ON_SubDVertex *v)

{
  if (v != (ON_SubDVertex *)0x0) {
    ReturnVertexEdgeAndFaceArrays(this,v);
    (v->super_ON_SubDComponentBase).m_archive_id = 0xffffffff;
    (v->super_ON_SubDComponentBase).m_status = ON_ComponentStatus::Deleted;
    v->m_next_vertex = this->m_unused_vertex;
    this->m_unused_vertex = v;
  }
  return;
}

Assistant:

void ON_SubDHeap::ReturnVertex(class ON_SubDVertex* v)
{
  if (nullptr != v)
  {
    ReturnVertexEdgeAndFaceArrays(v);
    (&v->m_id)[1] = ON_UNSET_UINT_INDEX; // m_archive_id == ON_UNSET_UINT_INDEX marks the fixed size pool element as unused
    v->m_status = ON_ComponentStatus::Deleted;
    v->m_next_vertex = m_unused_vertex;
    m_unused_vertex = v;
    // It is critical that v->m_symmetry_set_next remains set
    // so deleted elements of symmetric SubDs can be found.

    // NO! // m_fspv.ReturnElement(v);
    // See comments in AllocateVertexAndSetId();
  }
}